

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O0

void __thiscall BitField_Max_Test::TestBody(BitField_Max_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_278;
  Message local_270;
  unsigned_long local_268;
  value_type_conflict2 local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_13;
  Message local_240;
  uint local_234;
  value_type_conflict2 local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_12;
  Message local_210;
  uint local_208;
  value_type_conflict4 local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_11;
  Message local_1e8;
  unsigned_short local_1da;
  value_type_conflict2 local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_10;
  Message local_1b8;
  unsigned_short local_1ae;
  value_type_conflict4 local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_9;
  Message local_190;
  unsigned_short local_184;
  value_type_conflict3 local_182;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_8;
  Message local_168;
  uchar local_159;
  value_type_conflict2 local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_7;
  Message local_138;
  uchar local_12d;
  value_type_conflict4 local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_6;
  Message local_110;
  uchar local_103;
  value_type_conflict3 local_102;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_5;
  Message local_e8;
  uchar local_da;
  value_type local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  uint local_b4;
  value_type_conflict2 local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  uint local_88;
  value_type_conflict4 local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  uint local_60;
  value_type_conflict3 local_5a;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  uint local_28;
  value_type local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BitField_Max_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_21 = pstore::details::bit_field_base<unsigned_char,_0U,_1U,_void>::max();
  local_28 = 1;
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_int,_nullptr>
            ((EqHelper *)local_20,"(pstore::bit_field<std::uint8_t, 0, 1>::max ())","1U",&local_21,
             &local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5a = pstore::details::bit_field_base<unsigned_short,_0U,_1U,_void>::max();
  local_60 = 1;
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_int,_nullptr>
            ((EqHelper *)local_58,"(pstore::bit_field<std::uint16_t, 0, 1>::max ())","1U",&local_5a,
             &local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_84 = pstore::details::bit_field_base<unsigned_int,_0U,_1U,_void>::max();
  local_88 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_80,"(pstore::bit_field<std::uint32_t, 0, 1>::max ())","1U",&local_84,
             &local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0 = pstore::details::bit_field_base<unsigned_long,_0U,_1U,_void>::max();
  local_b4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_a8,"(pstore::bit_field<std::uint64_t, 0, 1>::max ())","1U",&local_b0,
             &local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d9 = pstore::details::bit_field_base<unsigned_char,_0U,_8U,_void>::max();
  local_da = std::numeric_limits<unsigned_char>::max();
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((EqHelper *)local_d8,"(pstore::bit_field<std::uint8_t, 0, 8>::max ())",
             "std::numeric_limits<std::uint8_t>::max ()",&local_d9,&local_da);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_102 = pstore::details::bit_field_base<unsigned_short,_0U,_8U,_void>::max();
  local_103 = std::numeric_limits<unsigned_char>::max();
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_char,_nullptr>
            ((EqHelper *)local_100,"(pstore::bit_field<std::uint16_t, 0, 8>::max ())",
             "std::numeric_limits<std::uint8_t>::max ()",&local_102,&local_103);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_12c = pstore::details::bit_field_base<unsigned_int,_0U,_8U,_void>::max();
  local_12d = std::numeric_limits<unsigned_char>::max();
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_char,_nullptr>
            ((EqHelper *)local_128,"(pstore::bit_field<std::uint32_t, 0, 8>::max ())",
             "std::numeric_limits<std::uint8_t>::max ()",&local_12c,&local_12d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_158 = pstore::details::bit_field_base<unsigned_long,_0U,_8U,_void>::max();
  local_159 = std::numeric_limits<unsigned_char>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_char,_nullptr>
            ((EqHelper *)local_150,"(pstore::bit_field<std::uint64_t, 0, 8>::max ())",
             "std::numeric_limits<std::uint8_t>::max ()",&local_158,&local_159);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_182 = pstore::details::bit_field_base<unsigned_short,_0U,_16U,_void>::max();
  local_184 = std::numeric_limits<unsigned_short>::max();
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_180,"(pstore::bit_field<std::uint16_t, 0, 16>::max ())",
             "std::numeric_limits<std::uint16_t>::max ()",&local_182,&local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1ac = pstore::details::bit_field_base<unsigned_int,_0U,_16U,_void>::max();
  local_1ae = std::numeric_limits<unsigned_short>::max();
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_short,_nullptr>
            ((EqHelper *)local_1a8,"(pstore::bit_field<std::uint32_t, 0, 16>::max ())",
             "std::numeric_limits<std::uint16_t>::max ()",&local_1ac,&local_1ae);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1d8 = pstore::details::bit_field_base<unsigned_long,_0U,_16U,_void>::max();
  local_1da = std::numeric_limits<unsigned_short>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_short,_nullptr>
            ((EqHelper *)local_1d0,"(pstore::bit_field<std::uint64_t, 0, 16>::max ())",
             "std::numeric_limits<std::uint16_t>::max ()",&local_1d8,&local_1da);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_204 = pstore::details::bit_field_base<unsigned_int,_0U,_32U,_void>::max();
  local_208 = std::numeric_limits<unsigned_int>::max();
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_200,"(pstore::bit_field<std::uint32_t, 0, 32>::max ())",
             "std::numeric_limits<std::uint32_t>::max ()",&local_204,&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_230 = pstore::details::bit_field_base<unsigned_long,_0U,_32U,_void>::max();
  local_234 = std::numeric_limits<unsigned_int>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_228,"(pstore::bit_field<std::uint64_t, 0, 32>::max ())",
             "std::numeric_limits<std::uint32_t>::max ()",&local_230,&local_234);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_260 = pstore::details::bit_field_base<unsigned_long,_0U,_64U,_void>::max();
  local_268 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_258,"(pstore::bit_field<std::uint64_t, 0, 64>::max ())",
             "std::numeric_limits<std::uint64_t>::max ()",&local_260,&local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_field.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  return;
}

Assistant:

TEST (BitField, Max) {
    EXPECT_EQ ((pstore::bit_field<std::uint8_t, 0, 1>::max ()), 1U);
    EXPECT_EQ ((pstore::bit_field<std::uint16_t, 0, 1>::max ()), 1U);
    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 1>::max ()), 1U);
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 1>::max ()), 1U);

    EXPECT_EQ ((pstore::bit_field<std::uint8_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint16_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 8>::max ()),
               std::numeric_limits<std::uint8_t>::max ());

    EXPECT_EQ ((pstore::bit_field<std::uint16_t, 0, 16>::max ()),
               std::numeric_limits<std::uint16_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 16>::max ()),
               std::numeric_limits<std::uint16_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 16>::max ()),
               std::numeric_limits<std::uint16_t>::max ());

    EXPECT_EQ ((pstore::bit_field<std::uint32_t, 0, 32>::max ()),
               std::numeric_limits<std::uint32_t>::max ());
    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 32>::max ()),
               std::numeric_limits<std::uint32_t>::max ());

    EXPECT_EQ ((pstore::bit_field<std::uint64_t, 0, 64>::max ()),
               std::numeric_limits<std::uint64_t>::max ());
}